

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O2

uint64_t lzma_lz_encoder_memusage(lzma_lz_options_conflict *lz_options)

{
  _Bool _Var1;
  uint64_t uVar2;
  lzma_mf mf;
  
  mf.nice_len = 0;
  mf.match_len_max = 0;
  mf.action = LZMA_RUN;
  mf.hash_count = 0;
  mf.cyclic_pos = 0;
  mf.cyclic_size = 0;
  mf.hash_mask = 0;
  mf.depth = 0;
  mf.hash = (uint32_t *)0x0;
  mf.son = (uint32_t *)0x0;
  mf.find = (_func_uint32_t_lzma_mf_ptr_lzma_match_ptr *)0x0;
  mf.skip = (_func_void_lzma_mf_ptr_uint32_t *)0x0;
  mf.read_limit = 0;
  mf.write_pos = 0;
  mf.pending = 0;
  mf._44_4_ = 0;
  mf.keep_size_after = 0;
  mf.offset = 0;
  mf.read_pos = 0;
  mf.read_ahead = 0;
  mf.buffer = (uint8_t *)0x0;
  mf.size = 0;
  mf.keep_size_before = 0;
  mf.sons_count = 0;
  mf._116_4_ = 0;
  _Var1 = lz_encoder_prepare(&mf,(lzma_allocator *)0x0,lz_options);
  if (_Var1) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = (mf._8_8_ & 0xffffffff) + ((mf._112_8_ & 0xffffffff) + ((ulong)mf._104_8_ >> 0x20)) * 4
            + 0xe0;
  }
  return uVar2;
}

Assistant:

extern uint64_t
lzma_lz_encoder_memusage(const lzma_lz_options *lz_options)
{
	// Old buffers must not exist when calling lz_encoder_prepare().
	lzma_mf mf = {
		.buffer = NULL,
		.hash = NULL,
		.son = NULL,
		.hash_count = 0,
		.sons_count = 0,
	};

	// Setup the size information into mf.
	if (lz_encoder_prepare(&mf, NULL, lz_options))
		return UINT64_MAX;

	// Calculate the memory usage.
	return ((uint64_t)(mf.hash_count) + mf.sons_count) * sizeof(uint32_t)
			+ mf.size + sizeof(lzma_coder);
}